

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_decompress.c
# Opt level: O0

size_t ZSTD_decompressionMargin(void *src,size_t srcSize)

{
  size_t code;
  uint uVar1;
  int iVar2;
  size_t code_00;
  uint local_94;
  size_t err_code;
  ZSTD_frameHeader zfh;
  unsigned_long_long decompressedBound;
  size_t compressedSize;
  ZSTD_frameSizeInfo frameSizeInfo;
  long lStack_28;
  uint maxBlockSize;
  size_t margin;
  size_t srcSize_local;
  void *src_local;
  
  lStack_28 = 0;
  frameSizeInfo.decompressedBound._4_4_ = 0;
  margin = srcSize;
  srcSize_local = (size_t)src;
  while( true ) {
    if (margin == 0) {
      return (ulong)frameSizeInfo.decompressedBound._4_4_ + lStack_28;
    }
    ZSTD_findFrameSizeInfo((ZSTD_frameSizeInfo *)&compressedSize,(void *)srcSize_local,margin);
    code = frameSizeInfo.nbBlocks;
    zfh._40_8_ = frameSizeInfo.compressedSize;
    code_00 = ZSTD_getFrameHeader((ZSTD_frameHeader *)&err_code,(void *)srcSize_local,margin);
    uVar1 = ERR_isError(code_00);
    if (uVar1 != 0) {
      return code_00;
    }
    uVar1 = ERR_isError(code);
    if ((uVar1 != 0) || (zfh._40_8_ == -2)) {
      return 0xffffffffffffffec;
    }
    if (zfh.windowSize._4_4_ == 0) {
      iVar2 = 0;
      if (zfh.headerSize != 0) {
        iVar2 = 4;
      }
      lStack_28 = compressedSize * 3 + (long)iVar2 + (ulong)zfh.blockSizeMax + lStack_28;
      if ((uint)zfh.windowSize < frameSizeInfo.decompressedBound._4_4_) {
        local_94 = frameSizeInfo.decompressedBound._4_4_;
      }
      else {
        local_94 = (uint)zfh.windowSize;
      }
      frameSizeInfo.decompressedBound._4_4_ = local_94;
    }
    else {
      if (zfh.windowSize._4_4_ != 1) {
        __assert_fail("zfh.frameType == ZSTD_skippableFrame",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/decompress/zstd_decompress.c"
                      ,0x35a,"size_t ZSTD_decompressionMargin(const void *, size_t)");
      }
      lStack_28 = code + lStack_28;
    }
    if (margin < code) break;
    srcSize_local = srcSize_local + code;
    margin = margin - code;
  }
  __assert_fail("srcSize >= compressedSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/decompress/zstd_decompress.c"
                ,0x35f,"size_t ZSTD_decompressionMargin(const void *, size_t)");
}

Assistant:

size_t ZSTD_decompressionMargin(void const* src, size_t srcSize)
{
    size_t margin = 0;
    unsigned maxBlockSize = 0;

    /* Iterate over each frame */
    while (srcSize > 0) {
        ZSTD_frameSizeInfo const frameSizeInfo = ZSTD_findFrameSizeInfo(src, srcSize);
        size_t const compressedSize = frameSizeInfo.compressedSize;
        unsigned long long const decompressedBound = frameSizeInfo.decompressedBound;
        ZSTD_frameHeader zfh;

        FORWARD_IF_ERROR(ZSTD_getFrameHeader(&zfh, src, srcSize), "");
        if (ZSTD_isError(compressedSize) || decompressedBound == ZSTD_CONTENTSIZE_ERROR)
            return ERROR(corruption_detected);

        if (zfh.frameType == ZSTD_frame) {
            /* Add the frame header to our margin */
            margin += zfh.headerSize;
            /* Add the checksum to our margin */
            margin += zfh.checksumFlag ? 4 : 0;
            /* Add 3 bytes per block */
            margin += 3 * frameSizeInfo.nbBlocks;

            /* Compute the max block size */
            maxBlockSize = MAX(maxBlockSize, zfh.blockSizeMax);
        } else {
            assert(zfh.frameType == ZSTD_skippableFrame);
            /* Add the entire skippable frame size to our margin. */
            margin += compressedSize;
        }

        assert(srcSize >= compressedSize);
        src = (const BYTE*)src + compressedSize;
        srcSize -= compressedSize;
    }

    /* Add the max block size back to the margin. */
    margin += maxBlockSize;

    return margin;
}